

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::containsRemovableLocals(PSNode *where,PointsToSetT *S)

{
  bool bVar1;
  Pointer PVar2;
  PSNodeAlloc *alloc;
  Pointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  PointsToSetT *__range2;
  const_iterator *in_stack_ffffffffffffff88;
  PSNodeAlloc *in_stack_ffffffffffffff90;
  Offset alloc_00;
  
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffff90);
  PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_ffffffffffffff90);
  do {
    bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    PVar2 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff88);
    bVar1 = Pointer::isNull((Pointer *)&stack0xffffffffffffff98);
    alloc_00 = PVar2.offset.offset;
    if (!bVar1) {
      bVar1 = Pointer::isUnknown((Pointer *)&stack0xffffffffffffff98);
      alloc_00 = PVar2.offset.offset;
      if (!bVar1) {
        bVar1 = Pointer::isInvalidated((Pointer *)&stack0xffffffffffffff98);
        alloc_00 = PVar2.offset.offset;
        if (!bVar1) {
          in_stack_ffffffffffffff90 =
               PSNodeAlloc::get<dg::pta::PSNode>((PSNode *)in_stack_ffffffffffffff90);
          alloc_00 = PVar2.offset.offset;
          if (((in_stack_ffffffffffffff90 != (PSNodeAlloc *)0x0) &&
              (bVar1 = isLocal((PSNodeAlloc *)alloc_00.offset,PVar2.target), bVar1)) &&
             (bVar1 = knownInstance((PSNode *)0x1b2783), bVar1)) {
            return true;
          }
        }
      }
    }
    PointerIdPointsToSet::const_iterator::operator++((const_iterator *)alloc_00.offset);
  } while( true );
}

Assistant:

static bool containsRemovableLocals(PSNode *where, PointsToSetT &S) {
        for (const auto &ptr : S) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                if (isLocal(alloc, where) && knownInstance(alloc))
                    return true;
            }
        }

        return false;
    }